

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

print * __thiscall
lest::for_test<lest::print>(lest *this,tests *specification,texts *in,print *perform,int n)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  int iVar4;
  fd_set *__exceptfds;
  int iVar5;
  fd_set *__writefds;
  long *plVar6;
  long *plVar7;
  undefined4 in_register_00000084;
  char *local_90;
  long local_88;
  char local_80 [16];
  long local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  
  iVar4 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar4 < 1);
  if (iVar4 == -1 || iVar4 >= 1) {
    plVar7 = *(long **)(this + 8);
    iVar5 = 0;
    do {
      plVar6 = *(long **)this;
      if (plVar6 != plVar7) {
        do {
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char*>((string *)local_68,*plVar6,plVar6[1] + *plVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)specification);
          iVar1 = select((int)(string *)local_68,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                         __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffffb8);
          if (local_68[0] != local_58) {
            operator_delete(local_68[0]);
          }
          if ((char)iVar1 != '\0') {
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*plVar6,plVar6[1] + *plVar6);
            local_70 = plVar6[4];
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)
                                (in->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,local_90,local_88);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            if (local_90 != local_80) {
              operator_delete(local_90);
            }
          }
          plVar7 = plVar6 + 5;
          plVar6 = plVar7;
        } while (plVar7 != *(long **)(this + 8));
      }
      iVar5 = iVar5 + 1;
      bVar3 = iVar5 < iVar4 || iVar4 == -1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),bVar3);
    } while (bVar3);
  }
  return (print *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}